

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiffInfo.cpp
# Opt level: O1

string * __thiscall
ApprovalTests::DiffInfo::getProgramForOs_abi_cxx11_(string *__return_storage_ptr__,DiffInfo *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  long lVar4;
  pointer replaceWith;
  string result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  possibleWindowsPaths;
  _Alloc_hider local_a8;
  size_type local_a0;
  char local_98;
  undefined7 uStack_97;
  undefined8 uStack_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  string local_50;
  
  local_a8._M_p = &local_98;
  pcVar2 = (this->program)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + (this->program)._M_string_length);
  paVar1 = &local_50.field_2;
  local_50.field_2._M_allocated_capacity._0_6_ = 0x72676f72507b;
  local_50.field_2._M_allocated_capacity._6_2_ = 0x6d61;
  local_50.field_2._8_6_ = 0x7d73656c6946;
  local_50._M_string_length = 0xe;
  local_50.field_2._M_local_buf[0xe] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  lVar4 = ::std::__cxx11::string::rfind((char *)&local_a8,(ulong)paVar1,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (lVar4 == 0) {
    getProgramFileLocations_abi_cxx11_();
    if (local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      replaceWith = local_88.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_a8._M_p,local_a8._M_p + local_a0);
        local_50.field_2._8_6_ = 0x7d73656c6946;
        local_50.field_2._M_allocated_capacity._0_6_ = 0x72676f72507b;
        local_50.field_2._M_allocated_capacity._6_2_ = 0x6d61;
        local_50._M_string_length = 0xe;
        local_50.field_2._M_local_buf[0xe] = '\0';
        local_50._M_dataplus._M_p = (pointer)paVar1;
        StringUtils::replaceAll
                  ((string *)__return_storage_ptr__,&local_70,&local_50,(string *)replaceWith);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        bVar3 = FileUtils::fileExists(__return_storage_ptr__);
        if (bVar3) {
          Catch::clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_88);
          goto LAB_0016bb48;
        }
        pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &__return_storage_ptr__->field_2) {
          operator_delete(pcVar2);
        }
        replaceWith = (pointer)((string *)replaceWith + 1);
      } while (replaceWith !=
               local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    Catch::clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_a8._M_p == &local_98) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_97,local_98);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_90;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_a8._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_97,local_98);
  }
  __return_storage_ptr__->_M_string_length = local_a0;
  local_a0 = 0;
  local_98 = '\0';
  local_a8._M_p = &local_98;
LAB_0016bb48:
  if (local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DiffInfo::getProgramForOs() const
    {
        std::string result = program;
        if (result.rfind(programFileTemplate(), 0) == 0)
        {
            std::vector<std::string> possibleWindowsPaths = getProgramFileLocations();
            for (const auto& path : possibleWindowsPaths)
            {
                auto result1 =
                    StringUtils::replaceAll(result, programFileTemplate(), path);
                if (FileUtils::fileExists(result1))
                {
                    return result1;
                }
            }
        }
        return result;
    }